

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_stuff.cpp
# Opt level: O1

bool CheatCheckList(event_t *ev,cheatseq_t *cheats,int numcheats)

{
  BYTE BVar1;
  byte bVar2;
  BYTE *pBVar3;
  bool bVar4;
  bool bVar5;
  
  if (numcheats < 1 || ev->type != '\x01') {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    do {
      BVar1 = (BYTE)ev->data2;
      if (cheats->Pos == (BYTE *)0x0) {
        cheats->Pos = cheats->Sequence;
        cheats->CurrentArg = '\0';
      }
      pBVar3 = cheats->Pos;
      if (*pBVar3 == '\0') {
        bVar2 = cheats->CurrentArg;
        cheats->CurrentArg = bVar2 + 1;
        cheats->Args[bVar2] = BVar1;
        cheats->Pos = pBVar3 + 1;
        bVar5 = true;
      }
      else if (*pBVar3 == BVar1) {
        cheats->Pos = pBVar3 + 1;
      }
      else {
        cheats->Pos = cheats->Sequence;
        cheats->CurrentArg = '\0';
      }
      if (*cheats->Pos == 0xff) {
        cheats->Pos = cheats->Sequence;
        cheats->CurrentArg = '\0';
        if ((cheats->DontCheck != '\0') || (bVar4 = CheckCheatmode(true), !bVar4)) {
          bVar4 = (*cheats->Handler)(cheats);
          bVar5 = (bool)(bVar5 | bVar4);
        }
      }
      else if (2 < (long)cheats->Pos - (long)cheats->Sequence) {
        bVar5 = true;
      }
      cheats = cheats + 1;
      numcheats = numcheats + -1;
    } while (numcheats != 0);
  }
  return bVar5;
}

Assistant:

static bool CheatCheckList (event_t *ev, cheatseq_t *cheats, int numcheats)
{
	bool eat = false;

	if (ev->type == EV_KeyDown)
	{
		int i;

		for (i = 0; i < numcheats; i++, cheats++)
		{
			if (CheatAddKey (cheats, (BYTE)ev->data2, &eat))
			{
				if (cheats->DontCheck || !CheckCheatmode ())
				{
					eat |= cheats->Handler (cheats);
				}
			}
			else if (cheats->Pos - cheats->Sequence > 2)
			{ // If more than two characters into the sequence,
			  // eat the keypress, just so that the Hexen cheats
			  // with T in them will work without unbinding T.
				eat = true;
			}
		}
	}
	return eat;
}